

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O0

string * __thiscall Quad::toString_abi_cxx11_(Quad *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string local_148;
  int local_128;
  undefined1 local_121;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  string *quadString;
  string local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *extremitiesString;
  Vec2d **extremities;
  Quad *this_local;
  
  extremities = (Vec2d **)this;
  extremitiesString = (string *)getExtremities(this);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  quadString._7_1_ = 1;
  Vec2d::toString_abi_cxx11_(&local_60,*(Vec2d **)extremitiesString);
  std::operator+(&local_40,&local_60," -> ");
  Vec2d::toString_abi_cxx11_(&local_90,(Vec2d *)extremitiesString->_M_string_length);
  std::operator+(pbVar1,&local_40,&local_90);
  quadString._7_1_ = 0;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_20 = pbVar1;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  local_121 = 1;
  std::__cxx11::to_string((string *)&i,this->vertexCount);
  std::operator+(&local_100," - QUAD (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::operator+(&local_e0,&local_100," vertices, Extremities: ");
  std::operator+(&local_c0,&local_e0,local_20);
  std::operator+(pbVar1,&local_c0,"):\n");
  local_121 = 0;
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&i);
  local_a0 = pbVar1;
  for (local_128 = 0; local_128 < this->vertexCount; local_128 = local_128 + 1) {
    std::__cxx11::string::operator+=((string *)local_a0,"   - ");
    Vec2d::toString_abi_cxx11_(&local_148,this->vertices[local_128]);
    std::__cxx11::string::operator+=((string *)local_a0,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::operator+=((string *)local_a0,"\n");
  }
  if (extremitiesString != (string *)0x0) {
    operator_delete__(extremitiesString);
  }
  return local_a0;
}

Assistant:

string* Quad::toString() {
    Vec2d** extremities = getExtremities();
    string* extremitiesString = new string(extremities[0]->toString() + " -> " + extremities[1]->toString());
    string* quadString = new string(" - QUAD (" + to_string(vertexCount) + " vertices, Extremities: " + *extremitiesString + "):\n");
    for (int i=0; i < vertexCount; i++) {
        *quadString += "   - ";
        *quadString += vertices[i]->toString();
        *quadString += "\n";
    }
    delete[] extremities;
    extremities = nullptr;
    return quadString;
}